

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O3

void __thiscall
vkt::sr::anon_unknown_0::IndexingTestUniformSetup::setup
          (IndexingTestUniformSetup *this,ShaderRenderCaseInstance *instance,Vec4 *constCoords)

{
  int i;
  long lVar1;
  TestError *this_00;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vector<float,_3> res_2;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_70 [16];
  char local_60 [16];
  undefined8 local_50;
  uint local_48;
  undefined8 local_40;
  uint local_38;
  undefined8 local_30;
  uint local_28;
  
  ShaderRenderCaseInstance::useUniform(instance,0,UI_ZERO);
  ShaderRenderCaseInstance::useUniform(instance,1,UI_ONE);
  ShaderRenderCaseInstance::useUniform(instance,2,UI_TWO);
  ShaderRenderCaseInstance::useUniform(instance,3,UI_THREE);
  ShaderRenderCaseInstance::useUniform(instance,4,UI_FOUR);
  if (this->m_usesArray != true) {
    return;
  }
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = (pointer)0x0;
  uStack_b0 = 0;
  switch(this->m_varType) {
  case TYPE_FLOAT:
    fVar2 = constCoords->m_data[0];
    local_b8 = (pointer)CONCAT44(fVar2,fVar2);
    uStack_b0 = CONCAT44(fVar2,fVar2);
    fVar5 = fVar2 * 0.5;
    local_a8 = CONCAT44(fVar5,fVar5);
    uStack_a0 = CONCAT44(fVar5,fVar5);
    fVar5 = fVar2 * 0.25;
    local_98 = CONCAT44(fVar5,fVar5);
    uStack_90 = CONCAT44(fVar5,fVar5);
    fVar2 = fVar2 * 0.125;
    fVar5 = fVar2;
    fVar3 = fVar2;
    fVar4 = fVar2;
    break;
  case TYPE_FLOAT_VEC2:
    local_b8 = *(pointer *)constCoords->m_data;
    fVar2 = SUB84(local_b8,0);
    fVar5 = (float)((ulong)local_b8 >> 0x20);
    local_a8 = CONCAT44(fVar5 * 0.5,fVar2 * 0.5);
    local_98 = CONCAT44(fVar5 * 0.25,fVar2 * 0.25);
    local_88 = CONCAT44(fVar5 * 0.125,fVar2 * 0.125);
    goto LAB_005a07c8;
  case TYPE_FLOAT_VEC3:
    local_b8 = *(pointer *)constCoords->m_data;
    local_70._8_4_ = constCoords->m_data[2];
    uStack_b0 = (ulong)(uint)local_70._8_4_;
    local_70._0_8_ = local_b8;
    local_30 = 0;
    local_28 = 0;
    lVar1 = 0;
    do {
      *(float *)((long)&local_30 + lVar1 * 4) = *(float *)(local_70 + lVar1 * 4) * 0.5;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    local_a8 = local_30;
    lVar1 = 0;
    uStack_a0 = (ulong)local_28;
    local_38 = 0;
    local_40 = 0;
    do {
      *(float *)((long)&local_40 + lVar1 * 4) = *(float *)(local_70 + lVar1 * 4) * 0.25;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    local_98 = local_40;
    lVar1 = 0;
    uStack_90 = (ulong)local_38;
    local_48 = 0;
    local_50 = 0;
    do {
      *(float *)((long)&local_50 + lVar1 * 4) = *(float *)(local_70 + lVar1 * 4) * 0.125;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    local_88 = local_50;
    uStack_80 = (ulong)local_48;
    goto LAB_005a07c8;
  case TYPE_FLOAT_VEC4:
    local_b8 = *(pointer *)constCoords->m_data;
    uStack_b0 = *(ulong *)(constCoords->m_data + 2);
    local_a8 = CONCAT44(constCoords->m_data[1] * 0.5,constCoords->m_data[0] * 0.5);
    uStack_a0 = CONCAT44(constCoords->m_data[3] * 0.5,constCoords->m_data[2] * 0.5);
    local_98 = CONCAT44(constCoords->m_data[1] * 0.25,constCoords->m_data[0] * 0.25);
    uStack_90 = CONCAT44(constCoords->m_data[3] * 0.25,constCoords->m_data[2] * 0.25);
    fVar2 = constCoords->m_data[0] * 0.125;
    fVar5 = constCoords->m_data[1] * 0.125;
    fVar3 = constCoords->m_data[2] * 0.125;
    fVar4 = constCoords->m_data[3] * 0.125;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    local_70._0_8_ = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"invalid data type for u_arr","");
    tcu::TestError::TestError(this_00,(string *)local_70);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_88 = CONCAT44(fVar5,fVar2);
  uStack_80 = CONCAT44(fVar4,fVar3);
LAB_005a07c8:
  ShaderRenderCaseInstance::addUniform(instance,5,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x40,&local_b8);
  return;
}

Assistant:

void IndexingTestUniformSetup::setup (ShaderRenderCaseInstance& instance, const tcu::Vec4& constCoords) const
{
	instance.useUniform(0u, UI_ZERO);
	instance.useUniform(1u, UI_ONE);
	instance.useUniform(2u, UI_TWO);
	instance.useUniform(3u, UI_THREE);
	instance.useUniform(4u, UI_FOUR);

	if (m_usesArray)
	{
		Vec4 arr[4];
		if (m_varType == TYPE_FLOAT)
		{
			arr[0] = Vec4(constCoords.x());
			arr[1] = Vec4(constCoords.x() * 0.5f);
			arr[2] = Vec4(constCoords.x() * 0.25f);
			arr[3] = Vec4(constCoords.x() * 0.125f);
		}
		else if (m_varType == TYPE_FLOAT_VEC2)
		{
			arr[0] = constCoords.swizzle(0, 1).toWidth<4>();
			arr[1] = (constCoords.swizzle(0, 1) * 0.5f).toWidth<4>();
			arr[2] = (constCoords.swizzle(0, 1) * 0.25f).toWidth<4>();
			arr[3] = (constCoords.swizzle(0, 1) * 0.125f).toWidth<4>();
		}
		else if (m_varType == TYPE_FLOAT_VEC3)
		{
			arr[0] = constCoords.swizzle(0, 1, 2).toWidth<4>();
			arr[1] = (constCoords.swizzle(0, 1, 2) * 0.5f).toWidth<4>();
			arr[2] = (constCoords.swizzle(0, 1, 2) * 0.25f).toWidth<4>();
			arr[3] = (constCoords.swizzle(0, 1, 2) * 0.125f).toWidth<4>();
		}
		else if (m_varType == TYPE_FLOAT_VEC4)
		{
			arr[0] = constCoords;
			arr[1] = constCoords * 0.5f;
			arr[2] = constCoords * 0.25f;
			arr[3] = constCoords * 0.125f;
		}
		else
			throw tcu::TestError("invalid data type for u_arr");

			instance.addUniform(5u, vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, sizeof(Vec4) * 4, arr[0].getPtr());
	}
}